

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

void * Cmd_RunAutoTunerEvalWorkerThread(void *pArg)

{
  int iVar1;
  int *pPlace;
  Cmd_AutoData_t *pThData;
  void *pArg_local;
  
  while( true ) {
    do {
    } while (*(int *)((long)pArg + 0x18) == 0);
    if (*(int *)((long)pArg + 0x18) == 0) break;
    if (*pArg == 0) {
      pthread_exit((void *)0x0);
    }
    iVar1 = Gia_ManSatokoCallOne(*pArg,*(satoko_opts_t **)((long)pArg + 8),-1);
    *(int *)((long)pArg + 0x1c) = iVar1;
    *(undefined4 *)((long)pArg + 0x18) = 0;
  }
  __assert_fail("pThData->fWorking",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                ,0x8a,"void *Cmd_RunAutoTunerEvalWorkerThread(void *)");
}

Assistant:

void * Cmd_RunAutoTunerEvalWorkerThread( void * pArg )
{
    Cmd_AutoData_t * pThData = (Cmd_AutoData_t *)pArg;
    volatile int * pPlace = &pThData->fWorking;
    while ( 1 )
    {
        while ( *pPlace == 0 );
        assert( pThData->fWorking );
        if ( pThData->pGia == NULL ) // kills itself when there is nothing to do
        {
            pthread_exit( NULL );
            assert( 0 );
            return NULL;
        }
        pThData->Result = Gia_ManSatokoCallOne( pThData->pGia, pThData->pOpts, -1 );
        pThData->fWorking = 0;
    }
    assert( 0 );
    return NULL;
}